

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

Vec_Str_t * Pdr_InvPrintStr(Vec_Int_t *vInv,Vec_Int_t *vCounts)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Str_t *p;
  Vec_Int_t *p_00;
  int *piVar4;
  void *__ptr;
  char *pBuffer;
  int *pList;
  int *pCube;
  int local_30;
  int k;
  int i;
  int nVars;
  Vec_Int_t *vMap;
  Vec_Str_t *vStr;
  Vec_Int_t *vCounts_local;
  Vec_Int_t *vInv_local;
  
  p = Vec_StrAlloc(1000);
  p_00 = Pdr_InvMap(vCounts);
  iVar1 = Vec_IntSize(vCounts);
  iVar2 = Vec_IntCountZero(vCounts);
  uVar3 = iVar1 - iVar2;
  piVar4 = Vec_IntArray(vInv);
  __ptr = malloc((ulong)uVar3);
  for (local_30 = 0; local_30 < (int)uVar3; local_30 = local_30 + 1) {
    *(undefined1 *)((long)__ptr + (long)local_30) = 0x2d;
  }
  pList = piVar4 + 1;
  for (local_30 = 0; local_30 < *piVar4; local_30 = local_30 + 1) {
    for (pCube._4_4_ = 0; pCube._4_4_ < *pList; pCube._4_4_ = pCube._4_4_ + 1) {
      iVar1 = Abc_LitIsCompl(pList[pCube._4_4_ + 1]);
      iVar2 = Abc_Lit2Var(pList[pCube._4_4_ + 1]);
      iVar2 = Vec_IntEntry(p_00,iVar2);
      *(byte *)((long)__ptr + (long)iVar2) = ((iVar1 != 0 ^ 0xffU) & 1) + 0x30;
    }
    for (pCube._4_4_ = 0; pCube._4_4_ < (int)uVar3; pCube._4_4_ = pCube._4_4_ + 1) {
      Vec_StrPush(p,*(char *)((long)__ptr + (long)pCube._4_4_));
    }
    Vec_StrPush(p,' ');
    Vec_StrPush(p,'1');
    Vec_StrPush(p,'\n');
    for (pCube._4_4_ = 0; pCube._4_4_ < *pList; pCube._4_4_ = pCube._4_4_ + 1) {
      iVar1 = Abc_Lit2Var(pList[pCube._4_4_ + 1]);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      *(undefined1 *)((long)__ptr + (long)iVar1) = 0x2d;
    }
    pList = pList + (*pList + 1);
  }
  Vec_StrPush(p,'\0');
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  Vec_IntFree(p_00);
  return p;
}

Assistant:

Vec_Str_t * Pdr_InvPrintStr( Vec_Int_t * vInv, Vec_Int_t * vCounts )
{
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_Int_t * vMap = Pdr_InvMap( vCounts );
    int nVars = Vec_IntSize(vCounts) - Vec_IntCountZero(vCounts);
    int i, k, * pCube, * pList = Vec_IntArray(vInv);
    char * pBuffer = ABC_ALLOC( char, (size_t)(unsigned)nVars );
    for ( i = 0; i < nVars; i++ )
        pBuffer[i] = '-';
    Pdr_ForEachCube( pList, pCube, i )
    {
        for ( k = 0; k < pCube[0]; k++ )
            pBuffer[Vec_IntEntry(vMap, Abc_Lit2Var(pCube[k+1]))] = '0' + !Abc_LitIsCompl(pCube[k+1]);
        for ( k = 0; k < nVars; k++ )
            Vec_StrPush( vStr, pBuffer[k] );
        Vec_StrPush( vStr, ' ' );
        Vec_StrPush( vStr, '1' );
        Vec_StrPush( vStr, '\n' );
        for ( k = 0; k < pCube[0]; k++ )
            pBuffer[Vec_IntEntry(vMap, Abc_Lit2Var(pCube[k+1]))] = '-';
    }
    Vec_StrPush( vStr, '\0' );
    ABC_FREE( pBuffer );
    Vec_IntFree( vMap );
    return vStr;
}